

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O1

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingLinkExpression(cmGeneratorExpressionDAGChecker *this)

{
  pointer __s1;
  size_type sVar1;
  int iVar2;
  size_type __rlen;
  cmGeneratorExpressionDAGChecker *pcVar3;
  bool bVar4;
  
  do {
    pcVar3 = this;
    this = pcVar3->Parent;
  } while (pcVar3->Parent != (cmGeneratorExpressionDAGChecker *)0x0);
  __s1 = (pcVar3->Property)._M_dataplus._M_p;
  sVar1 = (pcVar3->Property)._M_string_length;
  if ((sVar1 == 0x10) && (iVar2 = bcmp(__s1,"LINK_DIRECTORIES",0x10), iVar2 == 0)) {
    bVar4 = true;
  }
  else {
    if (sVar1 == 0xc) {
      iVar2 = bcmp(__s1,"LINK_OPTIONS",0xc);
      if (iVar2 == 0) {
        return true;
      }
      iVar2 = bcmp(__s1,"LINK_DEPENDS",0xc);
      if (iVar2 == 0) {
        return true;
      }
    }
    if (sVar1 == 0x15) {
      iVar2 = bcmp(__s1,"LINK_LIBRARY_OVERRIDE",0x15);
      bVar4 = iVar2 == 0;
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool cmGeneratorExpressionDAGChecker::EvaluatingLinkExpression() const
{
  cm::string_view property(this->Top()->Property);

  return property == "LINK_DIRECTORIES"_s || property == "LINK_OPTIONS"_s ||
    property == "LINK_DEPENDS"_s || property == "LINK_LIBRARY_OVERRIDE"_s;
}